

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_boolean_with_array(void)

{
  size_type sVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_2b8;
  basic_variable<std::allocator<char>_> *local_260;
  error *ex_1;
  basic_variable<std::allocator<char>_> local_218;
  basic_variable<std::allocator<char>_> local_1e8;
  undefined1 local_1b8 [77];
  undefined1 local_16b;
  undefined1 local_16a [2];
  undefined1 local_168 [8];
  variable data_1;
  error *ex;
  basic_variable<std::allocator<char>_> local_f8;
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 local_98 [93];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_38,false);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1d7,"void append_suite::append_boolean_with_array()",local_3a,&local_3b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_f8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_c8,"alpha");
  local_98._0_8_ = &local_f8;
  local_98._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  local_260 = (basic_variable<std::allocator<char>_> *)local_98;
  do {
    local_260 = local_260 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_260);
  } while (local_260 != &local_f8);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=({ true, \"alpha\" })","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1da,"void append_suite::append_boolean_with_array()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_168,false);
  local_16a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<bool>
                           ((basic_variable<std::allocator<char>_> *)local_168);
  local_16b = 1;
  sVar1 = 0x1de;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1de,"void append_suite::append_boolean_with_array()",local_16a,&local_16b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_218,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1e8,"alpha");
  local_1b8._0_8_ = &local_218;
  local_1b8._8_8_ = 2;
  init._M_len = sVar1;
  init._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1b8._0_8_,init);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_168,
             (basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10));
  local_2b8 = (basic_variable<std::allocator<char>_> *)local_1b8;
  do {
    local_2b8 = local_2b8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_2b8);
  } while (local_2b8 != &local_218);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(array::make({ true, \"alpha\" }))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1e1,"void append_suite::append_boolean_with_array()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_168);
  return;
}

Assistant:

void append_boolean_with_array()
{
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=({ true, "alpha" }),
                                        error,
                                        "incompatible type");
    }
    {
        variable data(false);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<bool>(), true);
        TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(array::make({ true, "alpha" })),
                                        error,
                                        "incompatible type");
    }
}